

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O2

string * __thiscall
sensors_analytics::Sdk::GetCookie_abi_cxx11_(string *__return_storage_ptr__,Sdk *this,bool decode)

{
  string cookie;
  string local_30;
  
  if (instance_ == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_30);
  }
  else {
    std::__cxx11::string::string((string *)&local_30,*(string **)(instance_ + 0x68));
    if ((char)this == '\0') {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_30);
    }
    else {
      utils::UrlDecode(__return_storage_ptr__,&local_30);
    }
    std::__cxx11::string::~string((string *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

string Sdk::GetCookie(bool decode) {
    if (instance_) {
        string cookie = instance_->consumer_->request_header_cookie;
        string decodeCookie = decode ? utils::UrlDecode(cookie) : cookie;
        return decodeCookie;
    }
    return "";
}